

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaLib.cpp
# Opt level: O1

int crnlib::LzmaCompress
              (uchar *dest,size_t *destLen,uchar *src,size_t srcLen,uchar *outProps,
              size_t *outPropsSize,int level,uint dictSize,int lc,int lp,int pb,int fb,
              int numThreads)

{
  SRes SVar1;
  CLzmaEncProps props;
  
  LzmaEncProps_Init(&props);
  props.level = level;
  props.dictSize = dictSize;
  props.lc = lc;
  props.lp = lp;
  props.pb = pb;
  props.fb = fb;
  props.numThreads = numThreads;
  SVar1 = LzmaEncode(dest,destLen,src,srcLen,&props,outProps,outPropsSize,0,(ICompressProgress *)0x0
                     ,(ISzAlloc *)g_Alloc,(ISzAlloc *)g_Alloc);
  return SVar1;
}

Assistant:

MY_STDAPI LzmaCompress(unsigned char* dest, size_t* destLen, const unsigned char* src, size_t srcLen,
                       unsigned char* outProps, size_t* outPropsSize,
                       int level,         /* 0 <= level <= 9, default = 5 */
                       unsigned dictSize, /* use (1 << N) or (3 << N). 4 KB < dictSize <= 128 MB */
                       int lc,            /* 0 <= lc <= 8, default = 3  */
                       int lp,            /* 0 <= lp <= 4, default = 0  */
                       int pb,            /* 0 <= pb <= 4, default = 2  */
                       int fb,            /* 5 <= fb <= 273, default = 32 */
                       int numThreads     /* 1 or 2, default = 2 */
                       ) {
  CLzmaEncProps props;
  LzmaEncProps_Init(&props);
  props.level = level;
  props.dictSize = dictSize;
  props.lc = lc;
  props.lp = lp;
  props.pb = pb;
  props.fb = fb;
  props.numThreads = numThreads;

  return LzmaEncode(dest, destLen, src, srcLen, &props, outProps, outPropsSize, 0,
                    NULL, &g_Alloc, &g_Alloc);
}